

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_node_data_t * mpack_node_map_uint_impl(mpack_node_t node,uint64_t num)

{
  mpack_error_t mVar1;
  mpack_node_data_t *pmVar2;
  mpack_node_data_t *key;
  size_t i;
  mpack_node_data_t *found;
  uint64_t num_local;
  mpack_node_t node_local;
  
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if ((node.data)->type == mpack_type_map) {
      i = 0;
      for (key = (mpack_node_data_t *)0x0; key < (mpack_node_data_t *)(ulong)(node.data)->len;
          key = (mpack_node_data_t *)((long)&key->type + 1)) {
        pmVar2 = mpack_node_child(node,(long)key << 1);
        if (((pmVar2->type == mpack_type_uint) && ((pmVar2->value).i == num)) ||
           ((pmVar2->type == mpack_type_int &&
            ((-1 < (pmVar2->value).i && ((pmVar2->value).i == num)))))) {
          if (i != 0) {
            mpack_node_flag_error(node,mpack_error_data);
            return (mpack_node_data_t *)0x0;
          }
          i = (size_t)mpack_node_child(node,(long)key * 2 + 1);
        }
      }
      if (i == 0) {
        node_local.tree = (mpack_tree_t *)0x0;
      }
      else {
        node_local.tree = (mpack_tree_t *)i;
      }
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (mpack_node_data_t *)node_local.tree;
}

Assistant:

static mpack_node_data_t* mpack_node_map_uint_impl(mpack_node_t node, uint64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_uint && key->value.u == num) ||
            (key->type == mpack_type_int && key->value.i >= 0 && (uint64_t)key->value.i == num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}